

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_thresh(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint32_t uVar6;
  miniscript_node_t *pmVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  miniscript_node_t *pmVar13;
  bool bVar14;
  
  pmVar13 = node->child;
  if (pmVar13 == (miniscript_node_t *)0x0) {
    return -2;
  }
  uVar3 = 0xffffffff;
  pmVar7 = pmVar13;
  do {
    pmVar7 = pmVar7->next;
    uVar3 = uVar3 + 1;
  } while (pmVar7 != (miniscript_node_t *)0x0);
  if (uVar3 < 3) {
    return -2;
  }
  if (pmVar13->info != (miniscript_item_t *)0x0) {
    return -2;
  }
  if (pmVar13->kind != 8) {
    return -2;
  }
  if (pmVar13->number < 0) {
    return -2;
  }
  uVar3 = (uint)pmVar13->number;
  if (uVar3 == 0) {
    return -2;
  }
  pmVar13 = pmVar13->next;
  if (pmVar13 == (miniscript_node_t *)0x0) {
    bVar5 = 1;
    uVar10 = 0;
    bVar2 = 1;
    iVar12 = 0;
    uVar4 = 0;
  }
  else {
    bVar2 = 1;
    iVar9 = 0;
    uVar4 = 0;
    iVar12 = 0;
    bVar5 = 1;
    do {
      if (pmVar13->info == (miniscript_item_t *)0x0) {
        return -2;
      }
      uVar10 = pmVar13->type_properties;
      bVar14 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      if (bVar14) {
        uVar1 = ~uVar10 & 0x1801;
      }
      else {
        uVar1 = ~uVar10 & 0x1808;
      }
      if (uVar1 != 0) {
        return -2;
      }
      bVar5 = bVar5 & (byte)(uVar10 >> 0xd) & 1;
      bVar2 = bVar2 & (byte)(uVar10 >> 0x10) & 1;
      uVar4 = uVar4 + ((uVar10 >> 0xf & 1) != 0);
      iVar12 = iVar12 + (2 - ((uVar10 >> 9 & 1) != 0) & (int)(uVar10 << 0x17) >> 0x1f);
      pmVar13 = pmVar13->next;
    } while (pmVar13 != (miniscript_node_t *)0x0);
    uVar10 = -iVar9;
  }
  if (uVar10 < uVar3) {
    return -2;
  }
  node->type_properties = 0x1801;
  if (iVar12 == 0) {
    uVar11 = 0x1901;
  }
  else {
    uVar11 = 0x1801;
    if (iVar12 != 1) goto LAB_001698d3;
    uVar11 = 0x1a01;
  }
  node->type_properties = uVar11;
LAB_001698d3:
  bVar8 = uVar4 == uVar10 & bVar5;
  bVar2 = bVar2 & bVar5 & uVar10 - uVar3 <= uVar4;
  uVar3 = (uVar10 - uVar3) + 1;
  if (((bVar8 != 0) || (bVar2 != 0)) || (uVar3 <= uVar4)) {
    uVar6 = uVar11 + 0x2000;
    if (bVar8 == 0) {
      uVar6 = uVar11;
    }
    uVar11 = uVar6 + 0x10000;
    if (bVar2 == 0) {
      uVar11 = uVar6;
    }
    uVar6 = uVar11 + 0x8000;
    if (uVar4 < uVar3) {
      uVar6 = uVar11;
    }
    node->type_properties = uVar6;
  }
  return 0;
}

Assistant:

static int verify_miniscript_thresh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *child = NULL;
    uint32_t count = 0;
    uint32_t k = 0;
    bool all_e = true;
    bool all_m = true;
    uint32_t args = 0;
    uint32_t num_s = 0;
    (void)parent;

    if (get_child_list_count(node) < 4)
        return WALLY_EINVAL;

    top = node->child;
    if (top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) || (top->number < 0))
        return WALLY_EINVAL;

    k = (uint32_t) top->number;
    if (k < 1)
        return WALLY_EINVAL;

    child = top->next;
    while (child) {
        if (!child->info)
            return WALLY_EINVAL;

        if (!count) {
            if (~(child->type_properties) & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
                return WALLY_EINVAL;
        } else if (~(child->type_properties) & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
            return WALLY_EINVAL;

        if (~(child->type_properties) & MINISCRIPT_PROPERTY_E)
            all_e = false;
        if (~(child->type_properties) & MINISCRIPT_PROPERTY_M)
            all_m = false;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_S)
            ++num_s;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_Z)
            args += (~(child->type_properties) & MINISCRIPT_PROPERTY_O) ? 2 : 1;

        ++count;
        child = child->next;
    }

    if (k > count)
        return WALLY_EINVAL;

    node->type_properties = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U;
    if (args == 0)
        node->type_properties |= MINISCRIPT_PROPERTY_Z;
    else if (args == 1)
        node->type_properties |= MINISCRIPT_PROPERTY_O;
    if (all_e && num_s == count)
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    if (all_e && all_m && num_s >= count - k)
        node->type_properties |= MINISCRIPT_PROPERTY_M;
    if (num_s >= count - k + 1)
        node->type_properties |= MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}